

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<kj::Maybe<kj::HttpHeaders::Request>_> __thiscall
kj::Promise<kj::Maybe<kj::HttpHeaders::Request>_>::exclusiveJoin
          (Promise<kj::Maybe<kj::HttpHeaders::Request>_> *this,
          Promise<kj::Maybe<kj::HttpHeaders::Request>_> *other)

{
  ExclusiveJoinPromiseNode *pEVar1;
  Own<kj::_::PromiseNode> *in_RDX;
  PromiseNode *extraout_RDX;
  Promise<kj::Maybe<kj::HttpHeaders::Request>_> PVar2;
  Own<kj::_::ExclusiveJoinPromiseNode> local_30;
  Own<kj::_::PromiseNode> local_20;
  
  heap<kj::_::ExclusiveJoinPromiseNode,kj::Own<kj::_::PromiseNode>,kj::Own<kj::_::PromiseNode>>
            ((kj *)&local_30,(Own<kj::_::PromiseNode> *)other,in_RDX);
  pEVar1 = local_30.ptr;
  local_20.disposer = local_30.disposer;
  local_30.ptr = (ExclusiveJoinPromiseNode *)0x0;
  (this->super_PromiseBase).node.disposer = local_30.disposer;
  (this->super_PromiseBase).node.ptr = &pEVar1->super_PromiseNode;
  local_20.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_20);
  Own<kj::_::ExclusiveJoinPromiseNode>::dispose(&local_30);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<kj::Maybe<kj::HttpHeaders::Request>_>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::exclusiveJoin(Promise<T>&& other) {
  return Promise(false, heap<_::ExclusiveJoinPromiseNode>(kj::mv(node), kj::mv(other.node)));
}